

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

bool __thiscall bloom_parameters::operator!(bloom_parameters *this)

{
  int __x;
  double dVar1;
  double extraout_XMM0_Qa;
  bool local_11;
  bloom_parameters *this_local;
  
  __x = (int)this;
  local_11 = true;
  if (((((this->minimum_size <= this->maximum_size) &&
        (local_11 = true, this->minimum_number_of_hashes <= this->maximum_number_of_hashes)) &&
       (local_11 = true, this->minimum_number_of_hashes != 0)) &&
      ((local_11 = true, this->maximum_number_of_hashes != 0 &&
       (local_11 = true, this->projected_element_count != 0)))) &&
     (local_11 = true,
     0.0 < this->false_positive_probability || this->false_positive_probability == 0.0)) {
    dVar1 = std::numeric_limits<double>::infinity();
    std::abs(__x);
    local_11 = true;
    if (((dVar1 != extraout_XMM0_Qa) || (NAN(dVar1) || NAN(extraout_XMM0_Qa))) &&
       (local_11 = true, this->random_seed != 0)) {
      local_11 = this->random_seed == 0xffffffffffffffff;
    }
  }
  return local_11;
}

Assistant:

inline bool operator!()
   {
      return (minimum_size > maximum_size)      ||
             (minimum_number_of_hashes > maximum_number_of_hashes) ||
             (minimum_number_of_hashes < 1)     ||
             (0 == maximum_number_of_hashes)    ||
             (0 == projected_element_count)     ||
             (false_positive_probability < 0.0) ||
             (std::numeric_limits<double>::infinity() == std::abs(false_positive_probability)) ||
             (0 == random_seed)                 ||
             (0xFFFFFFFFFFFFFFFFULL == random_seed);
   }